

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

void __thiscall
Clasp::DefaultUnfoundedCheck::addIfReason(DefaultUnfoundedCheck *this,BodyPtr *n,uint32 uScc)

{
  Literal p;
  uint uVar1;
  BodyNode *n_00;
  uint32 *x;
  bool bVar2;
  ulong uVar3;
  pointer pBVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  weight_t S;
  AddReasonLit addFalseLits;
  weight_t local_60;
  Literal local_5c;
  ulong local_58;
  uint32 *local_50;
  AddReasonLit local_48;
  
  n_00 = n->node;
  p.rep_ = (n_00->super_Node).lit.rep_;
  uVar8 = *(uint *)((long)(this->solver_->assign_).assign_.ebo_.buf + (ulong)(p.rep_ & 0xfffffffc));
  bVar6 = (byte)uVar8 & 3;
  bVar7 = ((p.rep_ & 2) == 0) + 1;
  uVar1 = *(uint *)&(n_00->super_Node).field_0x4;
  uVar5 = uVar1 & 0xfffffff;
  if (((byte)(uVar1 >> 0x1c) & uVar5 == uScc) == 0) {
    if ((bVar6 == bVar7) && (((p.rep_ & 2) * 2 + 4 & uVar8) == 0)) {
      if (uVar5 == uScc) {
        local_60 = 0;
        bVar2 = isExternal(this,n,&local_60);
        if (!bVar2) {
          return;
        }
      }
      addReasonLit(this,p);
      return;
    }
  }
  else {
    local_58 = (ulong)n->id;
    pBVar4 = (this->bodies_).ebo_.buf;
    uVar8 = *(uint *)(pBVar4 + local_58);
    if (-1 < (int)uVar8) {
      local_50 = &n->id;
      local_60 = (this->extended_).ebo_.buf[pBVar4[local_58].lower_or_ext]->slack;
      local_5c.rep_ = p.rep_;
      bVar2 = isExternal(this,n,&local_60);
      x = local_50;
      uVar3 = local_58;
      if (bVar2) {
        local_48.slack = local_60;
        local_48.self = this;
        local_48.node = n_00;
        if (bVar6 == bVar7) {
          addReasonLit(this,local_5c);
        }
        else {
          Asp::PrgDepGraph::visitBodyLiterals<Clasp::DefaultUnfoundedCheck::AddReasonLit>
                    (this->graph_,n_00,&local_48);
        }
        uVar3 = (ulong)*x;
        pBVar4 = (this->bodies_).ebo_.buf;
        uVar8 = *(uint *)(pBVar4 + uVar3);
      }
      *(uint *)(pBVar4 + uVar3) = uVar8 | 0x80000000;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->pickedExt_,x);
    }
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::addIfReason(const BodyPtr& n, uint32 uScc) {
	bool inF = solver_->isFalse(n.node->lit);
	weight_t S;
	if (!n.node->extended() || n.node->scc != uScc) {
		if (inF && !solver_->seen(n.node->lit) && (n.node->scc != uScc || isExternal(n, (S=0)))) {
			addReasonLit(n.node->lit);
		}
	}
	else if (bodies_[n.id].picked == 0) {
		if (isExternal(n, S = extended_[bodies_[n.id].lower_or_ext]->slack)) {
			AddReasonLit addFalseLits = { this, n.node, S };
			if (inF) { addReasonLit(n.node->lit); }
			else     { graph_->visitBodyLiterals(*n.node, addFalseLits); }
		}
		bodies_[n.id].picked = 1;
		pickedExt_.push_back(n.id);
	}
}